

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GuillotineBinPack.cpp
# Opt level: O2

Rect __thiscall
GuillotineBinPack::Insert
          (GuillotineBinPack *this,int width,int height,bool merge,
          FreeRectChoiceHeuristic rectChoice,GuillotineSplitHeuristic splitMethod)

{
  uint index;
  bool bVar1;
  int freeNodeIndex;
  Rect newRect;
  uint local_3c;
  Rect local_38;
  
  local_3c = 0;
  local_38 = FindPositionForNewNode(this,width,height,rectChoice,(int *)&local_3c);
  index = local_3c;
  if (local_38._8_8_ >> 0x20 != 0) {
    SplitFreeRectByHeuristic
              (this,(this->freeRectangles).Array + (int)local_3c,&local_38,splitMethod);
    TArray<Rect,_Rect>::Delete(&this->freeRectangles,index);
    if (merge) {
      MergeFreeList(this);
    }
    TArray<Rect,_Rect>::Push(&this->usedRectangles,&local_38);
    bVar1 = DisjointRectCollection::Add(&this->disjointRects,&local_38);
    if (!bVar1) {
      __assert_fail("disjointRects.Add(newRect) == true",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/GuillotineBinPack.cpp"
                    ,0x169,
                    "Rect GuillotineBinPack::Insert(int, int, bool, FreeRectChoiceHeuristic, GuillotineSplitHeuristic)"
                   );
    }
  }
  return local_38;
}

Assistant:

Rect GuillotineBinPack::Insert(int width, int height, bool merge, FreeRectChoiceHeuristic rectChoice, 
	GuillotineSplitHeuristic splitMethod)
{
	// Find where to put the new rectangle.
	int freeNodeIndex = 0;
	Rect newRect = FindPositionForNewNode(width, height, rectChoice, &freeNodeIndex);

	// Abort if we didn't have enough space in the bin.
	if (newRect.height == 0)
		return newRect;

	// Remove the space that was just consumed by the new rectangle.
	SplitFreeRectByHeuristic(freeRectangles[freeNodeIndex], newRect, splitMethod);
	freeRectangles.Delete(freeNodeIndex);

	// Perform a Rectangle Merge step if desired.
	if (merge)
		MergeFreeList();

	// Remember the new used rectangle.
	usedRectangles.Push(newRect);

	// Check that we're really producing correct packings here.
#ifdef _DEBUG
	assert(disjointRects.Add(newRect) == true);
#endif
	return newRect;
}